

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bool std::numeric_limits<fmt::v5::internal::dummy_int>::isnegative(double x)

{
  bool bVar1;
  undefined1 local_22 [2];
  int local_20;
  undefined4 uStack_1c;
  char buffer [2];
  int sign;
  int dec;
  double x_local;
  
  bVar1 = fmt::v5::internal::const_check<bool>(true);
  if (bVar1) {
    x_local._7_1_ = signbit(x);
  }
  else if (0.0 <= x) {
    bVar1 = isnotanumber<double>(x);
    if (bVar1) {
      uStack_1c = 0;
      local_20 = 0;
      fmt::v5::internal::_ecvt_s(x,local_22,2,0,&stack0xffffffffffffffe4,&local_20);
      x_local._7_1_ = local_20 != 0;
    }
    else {
      x_local._7_1_ = false;
    }
  }
  else {
    x_local._7_1_ = true;
  }
  return x_local._7_1_;
}

Assistant:

static bool isnegative(double x) {
    using namespace fmt::internal;
    if (const_check(sizeof(signbit(x)) != sizeof(fmt::internal::dummy_int)))
      return signbit(x) != 0;
    if (x < 0) return true;
    if (!isnotanumber(x)) return false;
    int dec = 0, sign = 0;
    char buffer[2];  // The buffer size must be >= 2 or _ecvt_s will fail.
    _ecvt_s(buffer, sizeof(buffer), x, 0, &dec, &sign);
    return sign != 0;
  }